

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_cmov(secp256k1_scalar *r,secp256k1_scalar *a,int flag)

{
  ulong uVar1;
  ulong uVar2;
  int in_EDX;
  secp256k1_scalar *in_RSI;
  secp256k1_scalar *in_RDI;
  int vflag;
  uint64_t mask1;
  uint64_t mask0;
  
  secp256k1_scalar_verify(in_RSI);
  uVar1 = (long)in_EDX - 1;
  uVar2 = uVar1 ^ 0xffffffffffffffff;
  in_RDI->d[0] = in_RDI->d[0] & uVar1 | in_RSI->d[0] & uVar2;
  in_RDI->d[1] = in_RDI->d[1] & uVar1 | in_RSI->d[1] & uVar2;
  in_RDI->d[2] = in_RDI->d[2] & uVar1 | in_RSI->d[2] & uVar2;
  in_RDI->d[3] = in_RDI->d[3] & uVar1 | in_RSI->d[3] & uVar2;
  secp256k1_scalar_verify(in_RDI);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_scalar_cmov(secp256k1_scalar *r, const secp256k1_scalar *a, int flag) {
    uint64_t mask0, mask1;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_CHECKMEM_CHECK_VERIFY(r->d, sizeof(r->d));

    mask0 = vflag + ~((uint64_t)0);
    mask1 = ~mask0;
    r->d[0] = (r->d[0] & mask0) | (a->d[0] & mask1);
    r->d[1] = (r->d[1] & mask0) | (a->d[1] & mask1);
    r->d[2] = (r->d[2] & mask0) | (a->d[2] & mask1);
    r->d[3] = (r->d[3] & mask0) | (a->d[3] & mask1);

    SECP256K1_SCALAR_VERIFY(r);
}